

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O3

double Chi2CDF(double x,int dof)

{
  double dVar1;
  
  dVar1 = 0.0;
  if (0.0 <= x && 0 < dof) {
    if (dof == 2) {
      dVar1 = exp(x * -0.5);
      dVar1 = 1.0 - dVar1;
    }
    else {
      dVar1 = RLGamma((double)dof * 0.5,x * 0.5);
      dVar1 = (double)(float)dVar1;
    }
  }
  return dVar1;
}

Assistant:

double Chi2CDF(double x, int dof) {
    if (dof < 1 || x < 0) {
        return 0.0;
    } else if (dof == 2) {
        return 1.0 - std::exp(-0.5 * x);
    } else {
        return (Float)RLGamma(0.5 * dof, 0.5 * x);
    }
}